

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_struct_writer
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result,
          bool uses_countsetfields)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar3;
  undefined4 extraout_var_00;
  reference pptVar4;
  string *psVar5;
  t_type *type;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  allocator local_439;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  int local_354;
  string local_350 [4];
  int32_t field_method_suffix_1;
  allocator local_329;
  string local_328 [8];
  string field_method_prefix_1;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  int local_1f4;
  string local_1f0 [4];
  int32_t field_method_suffix;
  allocator local_1c9;
  string local_1c8 [8];
  string field_method_prefix;
  string local_198;
  int32_t local_178;
  e_req local_174;
  int32_t field_id;
  e_req field_required;
  string escape_field_name;
  string field_name;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string tstruct_name_1;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  bool uses_countsetfields_local;
  bool is_result_local;
  string *tstruct_name_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  name.field_2._M_local_buf[0xe] = uses_countsetfields;
  name.field_2._M_local_buf[0xf] = is_result;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar2));
  this_00 = t_struct::get_sorted_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&tstruct_name_1.field_2 + 8));
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"func (p *");
  poVar3 = std::operator<<(poVar3,(string *)tstruct_name);
  poVar3 = std::operator<<(poVar3,") ");
  poVar3 = std::operator<<(poVar3,(string *)&this->write_method_name_);
  poVar3 = std::operator<<(poVar3,"(ctx context.Context, oprot thrift.TProtocol) error {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  bVar1 = t_struct::is_union(tstruct);
  if ((bVar1) && ((name.field_2._M_local_buf[0xe] & 1U) != 0)) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    publicize((string *)local_90,this,(string *)CONCAT44(extraout_var_00,iVar2),false);
    t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"if c := p.CountSetFields");
    poVar3 = std::operator<<(poVar3,(string *)local_90);
    poVar3 = std::operator<<(poVar3,"(); c != 1 {");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,
                             "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_f0);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_90);
  }
  t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteStructBegin(ctx, \"");
  poVar3 = std::operator<<(poVar3,(string *)&fields);
  poVar3 = std::operator<<(poVar3,"\"); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  t_generator::indent_abi_cxx11_((string *)((long)&field_name.field_2 + 8),&this->super_t_generator)
  ;
  poVar3 = std::operator<<(out,(string *)(field_name.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T write struct begin error: \", p), err) }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(escape_field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&field_id);
  local_178 = -1;
  t_generator::indent_abi_cxx11_(&local_198,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"if p != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  t_generator::indent_up(&this->super_t_generator);
  tstruct_name_1.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_method_prefix.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&tstruct_name_1.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_method_prefix.field_2 + 8));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"writeField",&local_1c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::operator=
              ((string *)(escape_field_name.field_2._M_local_buf + 8),(string *)psVar5);
    (*(this->super_t_generator)._vptr_t_generator[3])
              (local_1f0,this,(undefined1 *)((long)&escape_field_name.field_2 + 8));
    std::__cxx11::string::operator=((string *)&field_id,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    local_1f4 = t_field::get_key(*pptVar4);
    local_178 = local_1f4;
    if (local_1f4 < 0) {
      std::__cxx11::string::operator+=(local_1c8,"_");
      local_1f4 = -local_1f4;
    }
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_218);
    poVar3 = std::operator<<(poVar3,"if err := p.");
    poVar3 = std::operator<<(poVar3,local_1c8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f4);
    poVar3 = std::operator<<(poVar3,"(ctx, oprot); err != nil { return err }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string(local_1c8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&tstruct_name_1.field_2 + 8));
  }
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_238);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_238);
  t_generator::indent_abi_cxx11_(&local_258,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_258);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldStop(ctx); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_258);
  t_generator::indent_abi_cxx11_(&local_278,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_278);
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(\"write field stop error: \", err) }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_278);
  t_generator::indent_abi_cxx11_(&local_298,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_298);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteStructEnd(ctx); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_298);
  t_generator::indent_abi_cxx11_(&local_2b8,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_2b8);
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(\"write struct stop error: \", err) }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  t_generator::indent_abi_cxx11_(&local_2d8,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_2d8);
  poVar3 = std::operator<<(poVar3,"return nil");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2d8);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_2f8,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_2f8);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  tstruct_name_1.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_method_prefix_1.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&tstruct_name_1.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_method_prefix_1.field_2 + 8));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"writeField",&local_329);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    local_178 = t_field::get_key(*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::operator=
              ((string *)(escape_field_name.field_2._M_local_buf + 8),(string *)psVar5);
    (*(this->super_t_generator)._vptr_t_generator[3])
              (local_350,this,(undefined1 *)((long)&escape_field_name.field_2 + 8));
    std::__cxx11::string::operator=((string *)&field_id,local_350);
    std::__cxx11::string::~string(local_350);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    local_174 = t_field::get_req(*pptVar4);
    local_354 = local_178;
    if (local_178 < 0) {
      std::__cxx11::string::operator+=(local_328,"_");
      local_354 = -local_354;
    }
    t_generator::indent_abi_cxx11_(&local_378,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_378);
    poVar3 = std::operator<<(poVar3,"func (p *");
    poVar3 = std::operator<<(poVar3,(string *)tstruct_name);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,local_328);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_354);
    poVar3 = std::operator<<(poVar3,"(ctx context.Context, oprot thrift.TProtocol) (err error) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_378);
    t_generator::indent_up(&this->super_t_generator);
    if (local_174 == T_OPTIONAL) {
      t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_398);
      poVar3 = std::operator<<(poVar3,"if p.IsSet");
      publicize(&local_3b8,this,(string *)((long)&escape_field_name.field_2 + 8),false);
      poVar3 = std::operator<<(poVar3,(string *)&local_3b8);
      poVar3 = std::operator<<(poVar3,"() {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      t_generator::indent_up(&this->super_t_generator);
    }
    t_generator::indent_abi_cxx11_(&local_3d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_3d8);
    poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldBegin(ctx, \"");
    poVar3 = std::operator<<(poVar3,(string *)&field_id);
    poVar3 = std::operator<<(poVar3,"\", ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    type = t_field::get_type(*pptVar4);
    type_to_enum_abi_cxx11_(&local_3f8,this,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_3f8);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3,"); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
    t_generator::indent_abi_cxx11_(&local_418,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_418);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)&field_id);
    poVar3 = std::operator<<(poVar3,": \", p), err) }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&tstruct_name_1.field_2 + 8));
    tfield = *pptVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_438,"p.",&local_439);
    generate_serialize_field(this,out,tfield,&local_438,false);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    t_generator::indent_abi_cxx11_(&local_460,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_460);
    poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldEnd(ctx); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_460);
    t_generator::indent_abi_cxx11_(&local_480,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_480);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(fmt.Sprintf(\"%T write field end error ")
    ;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)&field_id);
    poVar3 = std::operator<<(poVar3,": \", p), err) }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_480);
    if (local_174 == T_OPTIONAL) {
      t_generator::indent_down(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_4a0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_4a0);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4a0);
    }
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_4c0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_4c0);
    poVar3 = std::operator<<(poVar3,"  return err");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4c0);
    t_generator::indent_abi_cxx11_(&local_4e0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_4e0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string(local_328);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&tstruct_name_1.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)&field_id);
  std::__cxx11::string::~string((string *)(escape_field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_writer(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result,
                                               bool uses_countsetfields) {
  (void)is_result;
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << write_method_name_ << "(ctx context.Context, oprot thrift.TProtocol) error {" << endl;
  indent_up();
  if (tstruct->is_union() && uses_countsetfields) {
    std::string tstruct_name(publicize(tstruct->get_name()));
    out << indent() << "if c := p.CountSetFields" << tstruct_name << "(); c != 1 {" << endl
        << indent()
        << "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
        << endl << indent() << "}" << endl;
  }
  out << indent() << "if err := oprot.WriteStructBegin(ctx, \"" << name << "\"); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T write struct begin error: \", p), err) }" << endl;

  string field_name;
  string escape_field_name;
  // t_const_value* field_default_value;
  t_field::e_req field_required;
  int32_t field_id = -1;

  out << indent() << "if p != nil {" << endl;
  indent_up();

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "if err := p." << field_method_prefix << field_method_suffix
        << "(ctx, oprot); err != nil { return err }" << endl;
  }

  indent_down();
  out << indent() << "}" << endl;

  // Write the struct map
  out << indent() << "if err := oprot.WriteFieldStop(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write field stop error: \", err) }" << endl;
  out << indent() << "if err := oprot.WriteStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write struct stop error: \", err) }" << endl;
  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_id = (*f_iter)->get_key();
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    // field_default_value = (*f_iter)->get_value();
    field_required = (*f_iter)->get_req();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ") " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, oprot thrift.TProtocol) (err error) {" << endl;
    indent_up();

    if (field_required == t_field::T_OPTIONAL) {
      out << indent() << "if p.IsSet" << publicize(field_name) << "() {" << endl;
      indent_up();
    }

    out << indent() << "if err := oprot.WriteFieldBegin(ctx, \"" << escape_field_name << "\", "
        << type_to_enum((*f_iter)->get_type()) << ", " << field_id << "); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "p.");

    // Write field closer
    out << indent() << "if err := oprot.WriteFieldEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field end error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    if (field_required == t_field::T_OPTIONAL) {
      indent_down();
      out << indent() << "}" << endl;
    }

    indent_down();
    out << indent() << "  return err" << endl;
    out << indent() << "}" << endl << endl;
  }
}